

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

sxi32 SyStrIsNumeric(char *zSrc,sxu32 nLen,sxu8 *pReal,char **pzTail)

{
  byte *pbVar1;
  byte bVar2;
  ushort *puVar3;
  ushort **ppuVar4;
  byte *pbVar5;
  byte *pbVar6;
  byte *pbVar7;
  byte *pbVar8;
  
  pbVar8 = (byte *)(zSrc + nLen);
  if (nLen != 0) {
    do {
      bVar2 = *zSrc;
      if ((0xffffffffffffffbf < (ulong)(long)(char)bVar2) ||
         (ppuVar4 = __ctype_b_loc(),
         (*(byte *)((long)*ppuVar4 + (long)(char)bVar2 * 2 + 1) & 0x20) == 0)) {
        if ((bVar2 == 0x2b) || (bVar2 == 0x2d)) {
          zSrc = (char *)((byte *)zSrc + 1);
        }
        break;
      }
      zSrc = (char *)((byte *)zSrc + 1);
    } while (zSrc < pbVar8);
  }
  if (pReal != (sxu8 *)0x0) {
    *pReal = '\0';
  }
  pbVar5 = (byte *)zSrc;
  if (zSrc < pbVar8) {
    pbVar5 = (byte *)zSrc + 3;
    pbVar7 = (byte *)zSrc;
    do {
      pbVar6 = pbVar5;
      bVar2 = pbVar6[-3];
      pbVar5 = pbVar7;
      if (0xffffffffffffffbf < (ulong)(long)(char)bVar2) goto LAB_0011ffe2;
      ppuVar4 = __ctype_b_loc();
      puVar3 = *ppuVar4;
      if ((*(byte *)((long)puVar3 + (long)(char)bVar2 * 2 + 1) & 8) == 0) {
        pbVar5 = pbVar6 + -3;
        goto LAB_0011ffe2;
      }
      pbVar1 = pbVar6 + -2;
      pbVar5 = pbVar7 + 1;
      if ((((pbVar8 <= pbVar1) || (0xffffffffffffffbf < (ulong)(long)(char)*pbVar1)) ||
          (pbVar5 = pbVar1, (*(byte *)((long)puVar3 + (long)(char)*pbVar1 * 2 + 1) & 8) == 0)) ||
         (pbVar1 = pbVar6 + -1, pbVar5 = pbVar1, pbVar8 <= pbVar1)) goto LAB_0011ffe2;
      pbVar5 = pbVar7 + 2;
      if (((0xffffffffffffffbf < (ulong)(long)(char)*pbVar1) ||
          ((*(byte *)((long)puVar3 + (long)(char)*pbVar1 * 2 + 1) & 8) == 0)) ||
         ((pbVar5 = pbVar7 + 3, pbVar8 <= pbVar6 ||
          ((0xffffffffffffffbf < (ulong)(long)(char)*pbVar6 ||
           (pbVar5 = pbVar6, (*(byte *)((long)puVar3 + (long)(char)*pbVar6 * 2 + 1) & 8) == 0))))))
      goto LAB_0011ffe2;
      pbVar7 = pbVar7 + 4;
      pbVar5 = pbVar6 + 4;
    } while (pbVar6 + 1 < pbVar8);
    pbVar5 = pbVar6 + 1;
LAB_0011ffe2:
    if ((zSrc < pbVar5 && pbVar5 < pbVar8) &&
       (((*pbVar5 == 0x2e || ((*pbVar5 & 0xdf) == 0x45)) &&
        (pbVar5 = pbVar5 + 1, pReal != (sxu8 *)0x0)))) {
      *pReal = '\x01';
    }
  }
  return (uint)(zSrc < pbVar5) * 9 + -9;
}

Assistant:

JX9_PRIVATE sxi32 SyStrIsNumeric(const char *zSrc, sxu32 nLen, sxu8 *pReal, const char  **pzTail)
{
	const char *zCur, *zEnd;
#ifdef UNTRUST
	if( SX_EMPTY_STR(zSrc) ){
		return SXERR_EMPTY;
	}
#endif
	zEnd = &zSrc[nLen];
	/* Jump leading white spaces */
	while( zSrc < zEnd && (unsigned char)zSrc[0] < 0xc0  && SyisSpace(zSrc[0]) ){
		zSrc++;
	}
	if( zSrc < zEnd && (zSrc[0] == '+' || zSrc[0] == '-') ){
		zSrc++;
	}
	zCur = zSrc;
	if( pReal ){
		*pReal = FALSE;
	}
	for(;;){
		if( zSrc >= zEnd || (unsigned char)zSrc[0] >= 0xc0 || !SyisDigit(zSrc[0]) ){ break; } zSrc++;
		if( zSrc >= zEnd || (unsigned char)zSrc[0] >= 0xc0 || !SyisDigit(zSrc[0]) ){ break; } zSrc++;
		if( zSrc >= zEnd || (unsigned char)zSrc[0] >= 0xc0 || !SyisDigit(zSrc[0]) ){ break; } zSrc++;
		if( zSrc >= zEnd || (unsigned char)zSrc[0] >= 0xc0 || !SyisDigit(zSrc[0]) ){ break; } zSrc++;
	};
	if( zSrc < zEnd && zSrc > zCur ){
		int c = zSrc[0];
		if( c == '.' ){
			zSrc++;
			if( pReal ){
				*pReal = TRUE;
			}
			if( pzTail ){
				while( zSrc < zEnd && (unsigned char)zSrc[0] < 0xc0 && SyisDigit(zSrc[0]) ){
					zSrc++;
				}
				if( zSrc < zEnd && (zSrc[0] == 'e' || zSrc[0] == 'E') ){
					zSrc++;
					if( zSrc < zEnd && (zSrc[0] == '+' || zSrc[0] == '-') ){
						zSrc++;
					}
					while( zSrc < zEnd && (unsigned char)zSrc[0] < 0xc0 && SyisDigit(zSrc[0]) ){
						zSrc++;
					}
				}
			}
		}else if( c == 'e' || c == 'E' ){
			zSrc++;
			if( pReal ){
				*pReal = TRUE;
			}
			if( pzTail ){
				if( zSrc < zEnd && (zSrc[0] == '+' || zSrc[0] == '-') ){
					zSrc++;
				}
				while( zSrc < zEnd && (unsigned char)zSrc[0] < 0xc0 && SyisDigit(zSrc[0]) ){
					zSrc++;
				}
			}
		}
	}
	if( pzTail ){
		/* Point to the non numeric part */
		*pzTail = zSrc;
	}
	return zSrc > zCur ? SXRET_OK /* String prefix is numeric */ : SXERR_INVALID /* Not a digit stream */;
}